

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void rw::ps2::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *pRVar1;
  undefined8 *puVar2;
  size_t sVar3;
  int32 local_70;
  int32 local_6c;
  StreamRasterExt streamExt;
  int32 sz;
  int32 len;
  Ps2Raster *ras;
  Raster *raster;
  Stream *stream_local;
  Texture *tex_local;
  
  pRVar1 = tex->raster;
  puVar2 = (undefined8 *)((long)&pRVar1->platform + (long)nativeRasterOffset);
  writeChunkHeader(stream,1,8);
  Stream::writeU32(stream,0x325350);
  Stream::writeU32(stream,tex->filterAddressing);
  sVar3 = strlen(tex->name);
  streamExt.mipmapVal = (int)sVar3 + 4U & 0xfffffffc;
  writeChunkHeader(stream,2,streamExt.mipmapVal);
  (*stream->_vptr_Stream[3])(stream,tex->name,(ulong)streamExt.mipmapVal);
  sVar3 = strlen(tex->mask);
  streamExt.mipmapVal = (int)sVar3 + 4U & 0xfffffffc;
  writeChunkHeader(stream,2,streamExt.mipmapVal);
  (*stream->_vptr_Stream[3])(stream,tex->mask,(ulong)streamExt.mipmapVal);
  streamExt.totalSize = *(int *)(puVar2 + 4) + *(int *)((long)puVar2 + 0x24);
  writeChunkHeader(stream,1,streamExt.totalSize + 0x58);
  writeChunkHeader(stream,1,0x40);
  local_70 = pRVar1->width;
  local_6c = pRVar1->height;
  streamExt.width = pRVar1->depth;
  streamExt.height._0_2_ = (ushort)pRVar1->format | (ushort)pRVar1->type;
  streamExt.height._2_2_ = 0;
  if ((*(char *)((long)puVar2 + 0x2c) == '\x02') && (pRVar1->depth == 8)) {
    streamExt.height._2_2_ = 1;
  }
  if ((*(byte *)((long)puVar2 + 0x2c) & 1) != 0) {
    streamExt.height._2_2_ = 2;
  }
  streamExt._8_8_ = *puVar2;
  streamExt.tex0._0_4_ = *(undefined4 *)(puVar2 + 1);
  streamExt.tex0._4_4_ = (uint)*(byte *)((long)puVar2 + 0xe);
  streamExt._24_8_ = puVar2[2];
  streamExt.miptbp1 = puVar2[3];
  streamExt.miptbp2._0_4_ = *(undefined4 *)(puVar2 + 4);
  streamExt.miptbp2._4_4_ = *(undefined4 *)((long)puVar2 + 0x24);
  streamExt.pixelSize = *(uint32 *)(puVar2 + 5);
  streamExt.paletteSize = (uint32)*(ushort *)((long)puVar2 + 0xc);
  (*stream->_vptr_Stream[3])(stream,&local_70,0x40);
  writeChunkHeader(stream,1,streamExt.totalSize);
  if (streamExt.height._2_2_ < 2) {
    (*stream->_vptr_Stream[3])(stream,pRVar1->pixels,(ulong)streamExt.totalSize);
  }
  else {
    (*stream->_vptr_Stream[3])
              (stream,*(undefined8 *)pRVar1->originalPixels,(ulong)*(uint *)(puVar2 + 4));
    (*stream->_vptr_Stream[3])(stream,pRVar1->palette + -0x50,(ulong)*(uint *)((long)puVar2 + 0x24))
    ;
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Ps2Raster *ras = GETPS2RASTEREXT(raster);
	writeChunkHeader(stream, ID_STRUCT, 8);
	stream->writeU32(FOURCC_PS2);
	stream->writeU32(tex->filterAddressing);
	int32 len = strlen(tex->name)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->name, len);
	len = strlen(tex->mask)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->mask, len);

	int32 sz = ras->pixelSize + ras->paletteSize;
	writeChunkHeader(stream, ID_STRUCT, 12 + 64 + 12 + sz);
	writeChunkHeader(stream, ID_STRUCT, 64);
	StreamRasterExt streamExt;
	streamExt.width = raster->width;
	streamExt.height = raster->height;
	streamExt.depth = raster->depth;
	streamExt.rasterFormat = raster->format | raster->type;
	streamExt.version = 0;
	if(ras->flags == Ps2Raster::SWIZZLED8 && raster->depth == 8)
		streamExt.version = 1;
	if(ras->flags & Ps2Raster::NEWSTYLE)
		streamExt.version = 2;
	streamExt.tex0 = ras->tex0;
	streamExt.paletteOffset = ras->paletteBase;
	streamExt.tex1low = ras->tex1low;
	streamExt.miptbp1 = ras->miptbp1;
	streamExt.miptbp2 = ras->miptbp2;
	streamExt.pixelSize = ras->pixelSize;
	streamExt.paletteSize = ras->paletteSize;
	streamExt.totalSize = ras->totalSize;
	streamExt.mipmapVal = ras->kl;
	ASSERTLITTLE;
	stream->write8(&streamExt, 64);

	writeChunkHeader(stream, ID_STRUCT, sz);
	if(streamExt.version < 2){
		stream->write8(raster->pixels, sz);
	}else{
		stream->write8(((Ps2Raster::PixelPtr*)raster->originalPixels)->pixels, ras->pixelSize);
		stream->write8(raster->palette-0x50, ras->paletteSize);
	}
}